

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O3

Token * __thiscall YAML::Scanner::PushToken(Scanner *this,TYPE type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Elt_pointer pTVar2;
  Token local_70;
  
  local_70.mark.pos = (this->INPUT).m_mark.pos;
  local_70.mark.line = (this->INPUT).m_mark.line;
  local_70.mark.column = (this->INPUT).m_mark.column;
  paVar1 = &local_70.value.field_2;
  local_70.status = VALID;
  local_70.value._M_string_length = 0;
  local_70.value.field_2._M_local_buf[0] = '\0';
  local_70.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_70.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_70.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_70._76_8_ = 0;
  local_70.type = type;
  local_70.value._M_dataplus._M_p = (pointer)paVar1;
  std::deque<YAML::Token,_std::allocator<YAML::Token>_>::emplace_back<YAML::Token>
            (&(this->m_tokens).c,&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70.params);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.value._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.value._M_dataplus._M_p);
  }
  pTVar2 = (this->m_tokens).c.super__Deque_base<YAML::Token,_std::allocator<YAML::Token>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pTVar2 == (this->m_tokens).c.super__Deque_base<YAML::Token,_std::allocator<YAML::Token>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    pTVar2 = (this->m_tokens).c.super__Deque_base<YAML::Token,_std::allocator<YAML::Token>_>._M_impl
             .super__Deque_impl_data._M_finish._M_node[-1] + 5;
  }
  return pTVar2 + -1;
}

Assistant:

Token* Scanner::PushToken(Token::TYPE type) {
  m_tokens.push(Token(type, INPUT.mark()));
  return &m_tokens.back();
}